

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_schnorrsig_compute_sigpoint
              (secp256k1_context *ctx,secp256k1_pubkey_conflict *sigpoint,uchar *msg32,
              secp256k1_xonly_pubkey *rx,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_ge pubkey_ge;
  uchar pk_buf [32];
  secp256k1_scalar e;
  uchar buf [32];
  uchar rx_buf [32];
  secp256k1_ge nonce_ge;
  secp256k1_ge sigpoint_ge;
  secp256k1_sha256 sha;
  secp256k1_gej pubkey_gej;
  secp256k1_gej sigpoint_gej;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)";
  }
  else if (msg32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msg32 != NULL";
  }
  else if (rx == (secp256k1_xonly_pubkey *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "rx != NULL";
  }
  else {
    if (pubkey != (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_xonly_pubkey_serialize(ctx,pk_buf,pubkey);
      secp256k1_xonly_pubkey_serialize(ctx,rx_buf,rx);
      secp256k1_schnorrsig_sha256_tagged(&sha);
      secp256k1_sha256_write(&sha,rx_buf,0x20);
      secp256k1_sha256_write(&sha,pk_buf,0x20);
      secp256k1_sha256_write(&sha,msg32,0x20);
      secp256k1_sha256_finalize(&sha,buf);
      secp256k1_scalar_set_b32(&e,buf,(int *)0x0);
      iVar1 = secp256k1_pubkey_load(ctx,&pubkey_ge,(secp256k1_pubkey_conflict *)pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_eckey_pubkey_tweak_mul(&ctx->ecmult_ctx,&pubkey_ge,&e);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&nonce_ge,(secp256k1_pubkey_conflict *)rx);
      if (iVar1 == 0) {
        return 0;
      }
      pubkey_gej.infinity = pubkey_ge.infinity;
      pubkey_gej.x.n[0] = pubkey_ge.x.n[0];
      pubkey_gej.x.n[1] = pubkey_ge.x.n[1];
      pubkey_gej.x.n[2] = pubkey_ge.x.n[2];
      pubkey_gej.x.n[3] = pubkey_ge.x.n[3];
      pubkey_gej.x.n[4] = pubkey_ge.x.n[4];
      pubkey_gej.y.n[0] = pubkey_ge.y.n[0];
      pubkey_gej.y.n[1] = pubkey_ge.y.n[1];
      pubkey_gej.y.n[2] = pubkey_ge.y.n[2];
      pubkey_gej.y.n[3] = pubkey_ge.y.n[3];
      pubkey_gej.y.n[4] = pubkey_ge.y.n[4];
      pubkey_gej.z.n[0] = 1;
      pubkey_gej.z.n[1] = 0;
      pubkey_gej.z.n[2] = 0;
      pubkey_gej.z.n[3] = 0;
      pubkey_gej.z.n[4] = 0;
      secp256k1_gej_add_ge(&sigpoint_gej,&pubkey_gej,&nonce_ge);
      secp256k1_ge_set_gej(&sigpoint_ge,&sigpoint_gej);
      secp256k1_pubkey_save(sigpoint,&sigpoint_ge);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_schnorrsig_compute_sigpoint(const secp256k1_context* ctx, secp256k1_pubkey *sigpoint, const unsigned char *msg32, const secp256k1_xonly_pubkey *rx, const secp256k1_xonly_pubkey *pubkey) {
    unsigned char pk_buf[32];
    unsigned char rx_buf[32];
    secp256k1_sha256 sha;
    unsigned char buf[32];
    secp256k1_gej pubkey_gej;
    secp256k1_ge pubkey_ge;
    secp256k1_ge nonce_ge;
    secp256k1_scalar e;
    secp256k1_gej sigpoint_gej;
    secp256k1_ge sigpoint_ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(rx != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_xonly_pubkey_serialize(ctx, pk_buf, pubkey);
    secp256k1_xonly_pubkey_serialize(ctx, rx_buf, rx);

    /* tagged hash(r.x, pk.x, msg32) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rx_buf, 32);
    secp256k1_sha256_write(&sha, pk_buf, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, buf);

    secp256k1_scalar_set_b32(&e, buf, NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    if (!secp256k1_eckey_pubkey_tweak_mul(&ctx->ecmult_ctx, &pubkey_ge, &e)) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &nonce_ge, rx)) {
        return 0;
    }

    secp256k1_gej_set_ge(&pubkey_gej, &pubkey_ge);
    secp256k1_gej_add_ge(&sigpoint_gej, &pubkey_gej, &nonce_ge);

    secp256k1_ge_set_gej(&sigpoint_ge, &sigpoint_gej);
    secp256k1_pubkey_save(sigpoint, &sigpoint_ge);

    return 1;
}